

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentiment.cpp
# Opt level: O0

PyObject * PyInit_sentiment(void)

{
  int iVar1;
  char *__s1;
  PyObject **ppPVar2;
  error_already_set *e;
  exception *e_1;
  handle local_30;
  module m;
  size_t len;
  char *runtime_ver;
  char *compiled_ver;
  
  __s1 = (char *)Py_GetVersion();
  m.super_object.super_handle.m_ptr = (object)strlen("3.10");
  iVar1 = strncmp(__s1,"3.10",(size_t)m.super_object.super_handle.m_ptr);
  if ((iVar1 == 0) &&
     ((__s1[(long)m.super_object.super_handle.m_ptr] < '0' ||
      ('9' < __s1[(long)m.super_object.super_handle.m_ptr])))) {
    pybind11::module::module((module *)&local_30,"sentiment",(char *)0x0);
    pybind11_init_sentiment((module *)&local_30);
    ppPVar2 = pybind11::handle::ptr(&local_30);
    compiled_ver = (char *)*ppPVar2;
    pybind11::module::~module((module *)&local_30);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    compiled_ver = (char *)0x0;
  }
  return (PyObject *)compiled_ver;
}

Assistant:

PYBIND11_MODULE(sentiment, m) {
    py::class_<KNNClassifier>(m, "KNNClassifier")
        .def(py::init<unsigned int>())
        .def("fit", &KNNClassifier::fit)
        .def("predict", &KNNClassifier::predict);

    py::class_<PCA>(m, "PCA")
        .def(py::init<unsigned int>())
        .def("fit", &PCA::fit)
        .def("transform", &PCA::transform);
    m.def(
        "power_iteration", &power_iteration,
        "Function that calculates eigenvector",
        py::arg("X"),
        py::arg("num_iter")=5000,
        py::arg("epsilon")=1e-16
    );
    m.def(
        "get_first_eigenvalues", &get_first_eigenvalues,
        "Function that calculates eigenvector",
        py::arg("X"),
        py::arg("num"),
        py::arg("num_iter")=5000,
        py::arg("epsilon")=1e-16
    );

}